

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardChars.h
# Opt level: O1

bool __thiscall
UnifiedRegex::StandardChars<char16_t>::ToEquivs
          (StandardChars<char16_t> *this,MappingSource mappingSource,Char c,Char *equivs)

{
  UnicodeDataCaseMapper *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  unsigned_long uVar4;
  undefined4 *puVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  undefined7 in_register_00000031;
  Type *pTVar9;
  Type local_38;
  unsigned_long lastOcc;
  
  iVar8 = (int)CONCAT71(in_register_00000031,mappingSource);
  if (iVar8 != 1) {
    if (iVar8 == 0) {
      this_00 = &this->unicodeDataCaseMapper;
      if ((ushort)c < 0x100) {
        BVar3 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                          (&this_00->toEquivs,(uint)(ushort)c);
        if (BVar3 == 0) {
          uVar4 = (this->unicodeDataCaseMapper).toEquivs.defv;
        }
        else {
          uVar4 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                            (&this_00->toEquivs,(uint)(ushort)c);
        }
      }
      else {
        bVar2 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                          (&this_00->toEquivs,(uint)(ushort)c,&local_38);
        pTVar9 = &(this->unicodeDataCaseMapper).toEquivs.defv;
        if (bVar2) {
          pTVar9 = &local_38;
        }
        uVar4 = *pTVar9;
      }
      lVar6 = 0;
      uVar7 = uVar4;
      if (uVar4 == 0xffffffffffffffff) {
        do {
          equivs[lVar6] = c;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
      }
      else {
        do {
          equivs[lVar6] = (Char)uVar7;
          lVar6 = lVar6 + 1;
          uVar7 = uVar7 >> 0x10;
        } while (lVar6 != 4);
      }
      return uVar4 != 0xffffffffffffffff;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/StandardChars.h"
                       ,0x166,"(mappingSource == CaseInsensitive::MappingSource::CaseFolding)",
                       "mappingSource == CaseInsensitive::MappingSource::CaseFolding");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::ToEquivs
                    (&this->caseFoldingCaseMapper,c,equivs);
  return bVar2;
}

Assistant:

inline bool ToEquivs(CaseInsensitive::MappingSource mappingSource, Char c, __out_ecount(4) Char* equivs) const
        {
            if (mappingSource == CaseInsensitive::MappingSource::UnicodeData)
            {
                return unicodeDataCaseMapper.ToEquivs(c, equivs);
            }
            else
            {
                Assert(mappingSource == CaseInsensitive::MappingSource::CaseFolding);
                return caseFoldingCaseMapper.ToEquivs(c, equivs);
            }
        }